

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFXMLScanner::scanReset(WFXMLScanner *this,InputSource *src)

{
  uint uVar1;
  int iVar2;
  XMLReader *reader;
  undefined4 extraout_var;
  RuntimeException *pRVar3;
  undefined4 extraout_var_00;
  XMLSize_t XVar4;
  XMLReader *newReader;
  InputSource *src_local;
  WFXMLScanner *this_local;
  
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    (*((this->super_XMLScanner).fDocHandler)->_vptr_XMLDocumentHandler[9])();
  }
  if ((this->super_XMLScanner).fEntityHandler != (XMLEntityHandler *)0x0) {
    (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[4])();
  }
  if ((this->super_XMLScanner).fErrorReporter != (XMLErrorReporter *)0x0) {
    (*((this->super_XMLScanner).fErrorReporter)->_vptr_XMLErrorReporter[3])();
  }
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  this->fElementIndex = 0;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::removeAll
            (this->fElementLookup);
  reader = ReaderMgr::createReader
                     (&(this->super_XMLScanner).fReaderMgr,src,true,RefFrom_NonLiteral,Type_General,
                      Source_External,(bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader == (XMLReader *)0x0) {
    uVar1 = (*src->_vptr_InputSource[6])();
    if ((uVar1 & 1) == 0) {
      pRVar3 = (RuntimeException *)__cxa_allocate_exception(0x30);
      iVar2 = (*src->_vptr_InputSource[5])();
      RuntimeException::RuntimeException
                (pRVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                 ,500,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_00,iVar2),
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(pRVar3,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    pRVar3 = (RuntimeException *)__cxa_allocate_exception(0x30);
    iVar2 = (*src->_vptr_InputSource[5])();
    RuntimeException::RuntimeException
              (pRVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,0x1f2,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var,iVar2),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(pRVar3,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  ReaderMgr::pushReader(&(this->super_XMLScanner).fReaderMgr,reader,(XMLEntityDecl *)0x0);
  if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
    XVar4 = (**(code **)(*(long *)(this->super_XMLScanner).fSecurityManager + 0x18))();
    (this->super_XMLScanner).fEntityExpansionLimit = XVar4;
    (this->super_XMLScanner).fEntityExpansionCount = 0;
  }
  return;
}

Assistant:

void WFXMLScanner::scanReset(const InputSource& src)
{
    //  For all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;
    fElementIndex = 0;

    // Reset elements lookup table
    fElementLookup->removeAll();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0) 
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
}